

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

VTable * __thiscall
flatbuffers::BinaryAnnotator::GetOrBuildVTable
          (BinaryAnnotator *this,uint64_t vtable_offset,Object *table,
          uint64_t offset_of_referring_table)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  uint64_t offset;
  ushort uVar4;
  _List_node_base *__position;
  mapped_type *pmVar5;
  undefined2 uVar6;
  uint64_t uVar7;
  ulong offset_00;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long *plVar11;
  _Alloc_hider _Var12;
  VTable *unaff_R13;
  VTable *pVVar13;
  ulong uVar14;
  long *plVar15;
  BinaryAnnotator *pBVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  iterator __end1;
  bool bVar18;
  uint16_t vtable_size;
  uint16_t fields_processed;
  VTable vtable;
  string referring_table_name;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegionComment vtable_size_comment;
  BinaryRegionComment ref_table_len_comment;
  BinaryRegionComment field_comment;
  uint64_t offset_start;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  fields;
  ushort local_7cc;
  ushort local_7ca;
  uint64_t local_7c8;
  BinaryAnnotator *local_7c0;
  undefined1 local_7b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_790;
  _Alloc_hider local_788;
  undefined4 local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  _Alloc_hider local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  _Alloc_hider local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  string local_718;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d8;
  ulong local_6d0;
  BinaryRegionStatus local_6c8;
  undefined1 *local_6c0;
  long local_6b8;
  undefined1 local_6b0;
  undefined7 uStack_6af;
  BinaryRegionCommentType local_6a0;
  undefined1 *local_698;
  long local_690;
  undefined1 local_688;
  undefined7 uStack_687;
  undefined1 *local_678;
  long local_670;
  undefined1 local_668;
  undefined7 uStack_667;
  size_t local_658;
  undefined1 local_650 [8];
  char *local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_628;
  undefined1 local_610 [24];
  uint64_t local_5f8;
  undefined1 local_5f0;
  undefined7 uStack_5ef;
  _Alloc_hider local_5e0;
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [24];
  undefined1 local_598;
  undefined7 uStack_597;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  undefined1 local_578;
  undefined7 uStack_577;
  ulong local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_560;
  long local_558;
  uint64_t local_550;
  undefined1 local_548 [16];
  _Base_ptr local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_520;
  ulong local_518;
  ulong local_510;
  long *local_508 [2];
  long local_4f8 [2];
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  BinaryRegionCommentType local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  ulong local_478;
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  BinaryRegionCommentType local_448;
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  ulong local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *pcStack_3e0;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  undefined1 local_318 [8];
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  BinaryRegionCommentType local_2f0;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  BinaryRegionCommentType local_278;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pointer local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_7c8 = vtable_offset;
  local_550 = offset_of_referring_table;
  __position = (_List_node_base *)
               std::
               map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
               ::operator[](&this->vtables_,&local_7c8);
  p_Var1 = __position->_M_next;
  bVar18 = p_Var1 == __position;
  if (!bVar18) {
    p_Var2 = p_Var1[1]._M_next;
    p_Var3 = p_Var1;
    unaff_R13 = (VTable *)(p_Var1 + 1);
    while (p_Var2 != (_List_node_base *)table) {
      p_Var3 = (((_List_base<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      bVar18 = p_Var3 == __position;
      unaff_R13 = (VTable *)(p_Var1 + 1);
      if (bVar18) break;
      unaff_R13 = (VTable *)(p_Var3 + 1);
      p_Var2 = p_Var3[1]._M_next;
    }
  }
  if (!bVar18) {
    return unaff_R13;
  }
  if ((p_Var1 == __position) && (bVar18 = ContainsSection(this,local_7c8), bVar18)) {
    return (VTable *)0x0;
  }
  if (*(ushort *)(table + -(long)*(int *)table) < 5) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)(table + (4 - (long)*(int *)table));
  }
  uVar14 = (ulong)uVar4;
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,table + *(uint *)(table + uVar14) + uVar14 + 4,
             table + (ulong)*(uint *)(table + *(uint *)(table + uVar14) + uVar14) +
                     *(uint *)(table + uVar14) + uVar14 + 4);
  uVar7 = local_7c8;
  local_6c0 = &local_6b0;
  local_6c8 = OK;
  uVar4 = 0;
  local_6b8 = 0;
  local_6b0 = 0;
  local_698 = &local_688;
  local_690 = 0;
  local_688 = 0;
  local_678 = &local_668;
  local_670 = 0;
  local_668 = 0;
  local_658 = 0;
  local_6a0 = VTableSize;
  uVar14 = this->binary_length_;
  if (local_7c8 + 1 < uVar14 && uVar14 >= 3) {
    uVar4 = *(ushort *)(this->binary_ + local_7c8);
  }
  local_7c0 = this;
  if (uVar14 <= local_7c8 + 1 || uVar14 < 3) {
    uVar7 = 0;
    if (local_7c8 <= uVar14) {
      uVar7 = uVar14 - local_7c8;
    }
    local_378[0] = local_368;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"2","");
    local_6c8 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_6c0);
    if (local_378[0] != local_368) {
      operator_delete(local_378[0],local_368[0] + 1);
    }
    offset = local_7c8;
    local_c0._0_4_ = local_6c8;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_6c0,local_6c0 + local_6b8);
    local_98 = local_6a0;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_698,local_698 + local_690);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_678,local_678 + local_670);
    local_50 = local_658;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_7b8,offset,uVar7,Unknown,uVar7,0,
               (BinaryRegionComment *)local_c0);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_650,&local_718,VTable,(BinaryRegion *)local_7b8);
    AddSection(local_7c0,offset,(BinarySection *)local_650);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_650._4_4_,local_650._0_4_) != &local_640) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_650._4_4_,local_650._0_4_),
                      local_640._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_p != &local_730) {
      operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_p != &local_750) {
      operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_p != &local_778) {
      operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
  }
  else {
    local_7cc = uVar4;
    if ((uVar4 + local_7c8) - 1 < uVar14) {
      if (3 < uVar4) {
        local_6f8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_6f8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_6f8.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a0._0_4_ = OK;
        local_298._M_p = (pointer)&local_288;
        std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_6c0);
        local_278 = local_6a0;
        local_270._M_p = (pointer)&local_260;
        local_6d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)table;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_698,local_698 + local_690);
        local_250._M_p = (pointer)&local_240;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,local_678,local_678 + local_670);
        local_230 = local_658;
        anon_unknown_49::MakeBinaryRegion
                  ((BinaryRegion *)local_7b8,uVar7,2,Uint16,0,0,(BinaryRegionComment *)local_2a0);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&local_6f8,(BinaryRegion *)local_7b8);
        pBVar16 = local_7c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_p != &local_730) {
          operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_p != &local_750) {
          operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_p != &local_778) {
          operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_p != &local_260) {
          operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_p != &local_288) {
          operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
        }
        uVar7 = local_7c8;
        uVar14 = local_7c8 + 2;
        local_648 = local_640._M_local_buf + 8;
        local_650._0_4_ = OK;
        uVar8 = 0;
        local_640._M_allocated_capacity = 0;
        local_640._M_local_buf[8] = '\0';
        local_628.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_610;
        local_628.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_610[0] = 0;
        local_610._16_8_ = &local_5f0;
        local_5f8 = 0;
        local_5f0 = 0;
        local_5e0._M_p = (pointer)0x0;
        local_628.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = VTableRefferingTableLength;
        uVar10 = pBVar16->binary_length_;
        if (local_7c8 + 3 < uVar10 && uVar10 >= 3) {
          uVar8 = (ulong)*(ushort *)(pBVar16->binary_ + uVar14);
        }
        if (uVar10 <= local_7c8 + 3 || uVar10 < 3) {
          uVar7 = 0;
          if (uVar14 <= uVar10) {
            uVar7 = uVar10 - uVar14;
          }
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"2","");
          local_650._0_4_ = ERROR_INCOMPLETE_BINARY;
          std::__cxx11::string::_M_assign((string *)&local_648);
          if (local_3d8[0] != local_3c8) {
            operator_delete(local_3d8[0],local_3c8[0] + 1);
          }
          local_228._0_4_ = local_650._0_4_;
          local_220._M_p = (pointer)&local_210;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,local_648,local_648 + local_640._M_allocated_capacity);
          local_200 = (BinaryRegionCommentType)
                      local_628.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1f8._M_p = (pointer)&local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,
                     local_628.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (undefined1 *)
                     ((long)&(local_628.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset +
                     (long)&(local_628.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset));
          local_1d8._M_p = (pointer)&local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_610._16_8_,
                     (undefined1 *)(local_610._16_8_ + local_5f8));
          local_1b8 = local_5e0._M_p;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_7b8,uVar14,uVar7,Unknown,uVar7,0,
                     (BinaryRegionComment *)local_228);
          anon_unknown_49::MakeSingleRegionBinarySection
                    ((BinarySection *)local_5d8,&local_718,VTable,(BinaryRegion *)local_7b8);
          AddSection(local_7c0,uVar14,(BinarySection *)local_5d8);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          ~vector((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  local_5b0);
          if ((undefined1 *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_) != local_5d0 + 8) {
            operator_delete((undefined1 *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_),
                            local_5d0._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_p != &local_730) {
            operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_p != &local_750) {
            operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_788._M_p != &local_778) {
            operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_p != &local_1c8) {
            operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_p != &local_1e8) {
            operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_p != &local_210) {
            operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
          }
          pVVar13 = (VTable *)0x0;
        }
        else {
          local_6d0 = uVar14;
          local_518 = uVar8;
          if ((local_550 + uVar8) - 1 < uVar10) {
            if ((ushort)uVar8 < 4) {
              plVar15 = local_348;
              local_358[0] = plVar15;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"4","");
              local_650._0_4_ = ERROR_LENGTH_TOO_SHORT;
              std::__cxx11::string::_M_assign((string *)&local_648);
              plVar11 = local_358[0];
              goto LAB_00310fa1;
            }
          }
          else {
            plVar15 = local_328;
            local_338[0] = plVar15;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"");
            local_650._0_4_ = ERROR_LENGTH_TOO_LONG;
            std::__cxx11::string::_M_assign((string *)&local_648);
            plVar11 = local_338[0];
LAB_00310fa1:
            if (plVar11 != plVar15) {
              operator_delete(plVar11,*plVar15 + 1);
            }
          }
          local_318._0_4_ = local_650._0_4_;
          local_310._M_p = (pointer)&local_300;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_648,local_648 + local_640._M_allocated_capacity);
          local_2f0 = (BinaryRegionCommentType)
                      local_628.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_2e8._M_p = (pointer)&local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e8,
                     local_628.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (undefined1 *)
                     ((long)&(local_628.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->offset +
                     (long)&(local_628.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset));
          local_2c8._M_p = (pointer)&local_2b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c8,local_610._16_8_,
                     (undefined1 *)(local_610._16_8_ + local_5f8));
          local_2a8 = local_5e0._M_p;
          anon_unknown_49::MakeBinaryRegion
                    ((BinaryRegion *)local_7b8,local_6d0,2,Uint16,0,0,
                     (BinaryRegionComment *)local_318);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&local_6f8,(BinaryRegion *)local_7b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_p != &local_730) {
            operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_760._M_p != &local_750) {
            operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_788._M_p != &local_778) {
            operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_p != &local_2b8) {
            operator_delete(local_2c8._M_p,local_2b8._M_allocated_capacity + 1);
          }
          pBVar16 = local_7c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_p != &local_2d8) {
            operator_delete(local_2e8._M_p,local_2d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_p != &local_300) {
            operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
          }
          local_558 = uVar7 + 4;
          local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_548 + 8);
          local_548._8_4_ = _S_red;
          local_538 = (_Base_ptr)0x0;
          local_520 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          local_7ca = 0;
          local_3f8._M_unused._M_object = (void *)0x0;
          local_3f8._8_8_ = 0;
          local_3e8 = (code *)0x0;
          pcStack_3e0 = (code *)0x0;
          paStack_528 = local_530;
          local_3f8._M_unused._M_object = operator_new(0x40);
          *(long **)local_3f8._M_unused._0_8_ = &local_558;
          *(uint64_t **)((long)local_3f8._M_unused._0_8_ + 8) = &local_7c8;
          *(ushort **)((long)local_3f8._M_unused._0_8_ + 0x10) = &local_7cc;
          *(BinaryAnnotator **)((long)local_3f8._M_unused._0_8_ + 0x18) = pBVar16;
          *(vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> **)
           ((long)local_3f8._M_unused._0_8_ + 0x20) = &local_6f8;
          *(uint64_t **)((long)local_3f8._M_unused._0_8_ + 0x28) = &local_550;
          *(undefined1 **)((long)local_3f8._M_unused._0_8_ + 0x30) = local_548;
          *(ushort **)((long)local_3f8._M_unused._0_8_ + 0x38) = &local_7ca;
          pcStack_3e0 = std::
                        _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                        ::_M_invoke;
          local_3e8 = std::
                      _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                      ::_M_manager;
          ForAllFields((Object *)local_6d8->_M_local_buf,false,
                       (function<void_(const_reflection::Field_*)> *)&local_3f8);
          if (local_3e8 != (code *)0x0) {
            (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
          }
          uVar14 = (ulong)local_7ca;
          uVar4 = (ushort)(local_7cc + 0x1fffc >> 1);
          if ((ushort)(local_7ca * 3) < uVar4) {
            uVar4 = local_7ca * 3;
          }
          if (local_7ca < uVar4) {
            local_560 = &local_730;
            local_510 = (ulong)uVar4;
            uVar10 = (ulong)((uint)local_7ca * 2);
            do {
              local_5d0._0_8_ = local_5c0;
              uVar8 = pBVar16->binary_length_;
              bVar18 = uVar8 <= uVar10 + local_558 + 1;
              if (bVar18 || uVar8 < 3) {
                uVar6 = Unknown;
              }
              else {
                uVar6 = *(undefined2 *)(pBVar16->binary_ + uVar10 + local_558);
              }
              offset_00 = local_558 + uVar10;
              local_5d8._0_4_ = OK;
              local_5d0._8_8_ = 0;
              local_5c0[0] = Unknown;
              local_5b0._8_8_ = &local_598;
              local_5b0._16_8_ = 0;
              local_598 = 0;
              local_588._M_allocated_capacity = (size_type)&local_578;
              local_588._8_8_ = 0;
              local_578 = 0;
              local_5b0._0_4_ = VTableUnknownFieldOffset;
              local_6d0 = uVar10;
              local_568 = uVar14;
              if (bVar18 || uVar8 < 3) {
                uVar7 = 0;
                if (offset_00 <= uVar8) {
                  uVar7 = uVar8 - offset_00;
                }
                local_508[0] = local_4f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"2","");
                local_5d8._0_4_ = ERROR_INCOMPLETE_BINARY;
                std::__cxx11::string::_M_assign((string *)local_5d0);
                if (local_508[0] != local_4f8) {
                  operator_delete(local_508[0],local_4f8[0] + 1);
                }
                local_470._0_4_ = local_5d8._0_4_;
                local_468._M_p = (pointer)&local_458;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_468,local_5d0._0_8_,
                           (undefined1 *)(local_5d0._8_8_ + local_5d0._0_8_));
                local_448 = local_5b0._0_4_;
                local_440._M_p = (pointer)&local_430;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_440,local_5b0._8_8_,
                           (undefined1 *)(local_5b0._16_8_ + local_5b0._8_8_));
                local_420._M_p = (pointer)&local_410;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_420,local_588._M_allocated_capacity,
                           (undefined1 *)(local_588._8_8_ + local_588._M_allocated_capacity));
                local_400 = local_568;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_7b8,offset_00,uVar7,Unknown,uVar7,0,
                           (BinaryRegionComment *)local_470);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_6f8,(BinaryRegion *)local_7b8);
                pBVar16 = local_7c0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_740._M_p != local_560) {
                  operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_760._M_p != &local_750) {
                  operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_788._M_p != &local_778) {
                  operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_420._M_p != &local_410) {
                  operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_440._M_p != &local_430) {
                  operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
                }
                uVar9 = local_458._M_allocated_capacity;
                _Var12._M_p = local_468._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_p != &local_458) goto LAB_0031179c;
              }
              else {
                local_7b8._0_2_ = (short)uVar14;
                local_7b8._8_8_ = (Field *)0x0;
                local_7a8._M_allocated_capacity._0_2_ = uVar6;
                std::
                _Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                ::
                _M_emplace_unique<std::pair<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry>>
                          ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                            *)local_548,
                           (pair<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> *)
                           local_7b8);
                local_4e8._0_4_ = local_5d8._0_4_;
                local_4e0._M_p = (pointer)&local_4d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4e0,local_5d0._0_8_,
                           (undefined1 *)(local_5d0._8_8_ + local_5d0._0_8_));
                local_4c0 = local_5b0._0_4_;
                local_4b8._M_allocated_capacity = (size_type)&local_4a8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4b8,local_5b0._8_8_,
                           (undefined1 *)(local_5b0._16_8_ + local_5b0._8_8_));
                local_498._M_p = (pointer)&local_488;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_498,local_588._M_allocated_capacity,
                           (undefined1 *)(local_588._8_8_ + local_588._M_allocated_capacity));
                local_478 = local_568;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_7b8,offset_00,2,VOffset,0,0,
                           (BinaryRegionComment *)local_4e8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>(&local_6f8,(BinaryRegion *)local_7b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_740._M_p != local_560) {
                  operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_760._M_p != &local_750) {
                  operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_788._M_p != &local_778) {
                  operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_p != &local_488) {
                  operator_delete(local_498._M_p,local_488._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_allocated_capacity != &local_4a8) {
                  operator_delete((void *)local_4b8._M_allocated_capacity,
                                  local_4a8._M_allocated_capacity + 1);
                }
                uVar9 = local_4d0._M_allocated_capacity;
                _Var12._M_p = local_4e0._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_p != &local_4d0) {
LAB_0031179c:
                  operator_delete(_Var12._M_p,uVar9 + 1);
                }
              }
              if ((undefined1 *)local_588._M_allocated_capacity != &local_578) {
                operator_delete((void *)local_588._M_allocated_capacity,
                                CONCAT71(uStack_577,local_578) + 1);
              }
              if ((undefined1 *)local_5b0._8_8_ != &local_598) {
                operator_delete((void *)local_5b0._8_8_,CONCAT71(uStack_597,local_598) + 1);
              }
              if ((undefined1 *)local_5d0._0_8_ != local_5c0) {
                operator_delete((void *)local_5d0._0_8_,CONCAT71(local_5c0._1_7_,local_5c0[0]) + 1);
              }
              uVar14 = uVar14 + 1;
              uVar10 = local_6d0 + 2;
            } while (local_510 != uVar14);
          }
          if (__position->_M_next == __position) {
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_6f8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_6f8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_48.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_6f8.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_6f8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_6f8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_6f8.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            anon_unknown_49::MakeBinarySection
                      ((BinarySection *)local_7b8,&local_718,VTable,&local_48);
            pmVar5 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&pBVar16->sections_,&local_7c8);
            BinarySection::operator=(pmVar5,(BinarySection *)local_7b8);
            BinarySection::~BinarySection((BinarySection *)local_7b8);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            ~vector(&local_48);
            paVar17 = local_6d8;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_7b8,", ",&local_718);
            pmVar5 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&pBVar16->sections_,&local_7c8);
            std::__cxx11::string::_M_append((char *)pmVar5,local_7b8._0_8_);
            paVar17 = local_6d8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7b8._0_8_ != &local_7a8) {
              operator_delete((void *)local_7b8._0_8_,
                              CONCAT44(local_7a8._M_allocated_capacity._4_4_,
                                       CONCAT22(local_7a8._M_allocated_capacity._2_2_,
                                                local_7a8._M_allocated_capacity._0_2_)) + 1);
            }
          }
          local_7a8._M_allocated_capacity._0_2_ = Unknown;
          local_7a8._M_allocated_capacity._2_2_ = Unknown >> 0x10;
          local_7a8._8_8_ = 0;
          local_788._M_p = (pointer)0x0;
          local_780._0_2_ = 0;
          local_780._2_2_ = 0;
          local_7b8._0_8_ = paVar17;
          local_798 = &local_7a8;
          paStack_790 = &local_7a8;
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::clear((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                   *)(local_7b8 + 8));
          if (local_538 != (_Base_ptr)0x0) {
            local_7a8._M_allocated_capacity._0_2_ = (undefined2)local_548._8_4_;
            local_7a8._M_allocated_capacity._2_2_ = SUB42(local_548._8_4_,2);
            local_7a8._8_8_ = local_538;
            local_798 = local_530;
            paStack_790 = paStack_528;
            local_538->_M_parent = (_Base_ptr)&local_7a8;
            local_788._M_p = (pointer)local_520;
            local_538 = (_Base_ptr)0x0;
            local_530 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_548 + 8);
            local_520 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            paStack_528 = local_530;
          }
          local_780._2_2_ = (uint16_t)local_518;
          local_780._0_2_ = local_7cc;
          std::__cxx11::
          list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
          ::_M_insert<flatbuffers::BinaryAnnotator::VTable>
                    ((list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                      *)__position,(iterator)__position,(VTable *)local_7b8);
          pVVar13 = (VTable *)(__position->_M_prev + 1);
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)(local_7b8 + 8));
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)local_548);
        }
        if ((undefined1 *)local_610._16_8_ != &local_5f0) {
          operator_delete((void *)local_610._16_8_,CONCAT71(uStack_5ef,local_5f0) + 1);
        }
        if (local_628.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_610) {
          operator_delete(local_628.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          CONCAT71(local_610._1_7_,local_610[0]) + 1);
        }
        if (local_648 != local_640._M_local_buf + 8) {
          operator_delete(local_648,CONCAT71(local_640._9_7_,local_640._M_local_buf[8]) + 1);
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_6f8);
        goto LAB_0031099b;
      }
      local_3b8[0] = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"4","");
      local_6c8 = ERROR_LENGTH_TOO_SHORT;
      std::__cxx11::string::_M_assign((string *)&local_6c0);
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0],local_3a8[0] + 1);
      }
      uVar7 = local_7c8;
      local_1b0._0_4_ = local_6c8;
      local_1a8._M_p = (pointer)&local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_6c0,local_6c0 + local_6b8);
      local_188 = local_6a0;
      local_180._M_p = (pointer)&local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_698,local_698 + local_690);
      local_160._M_p = (pointer)&local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_678,local_678 + local_670);
      local_140 = local_658;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_7b8,uVar7,2,Uint16,0,0,(BinaryRegionComment *)local_1b0);
      anon_unknown_49::MakeSingleRegionBinarySection
                ((BinarySection *)local_650,&local_718,VTable,(BinaryRegion *)local_7b8);
      AddSection(local_7c0,uVar7,(BinarySection *)local_650);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_628);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_650._4_4_,local_650._0_4_) != &local_640) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_650._4_4_,local_650._0_4_),
                        local_640._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_p != &local_730) {
        operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_p != &local_750) {
        operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_p != &local_778) {
        operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
      }
      local_120._M_allocated_capacity = local_198._M_allocated_capacity;
      _Var12._M_p = local_1a8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p != &local_198) goto LAB_00310988;
    }
    else {
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
      local_6c8 = ERROR_LENGTH_TOO_LONG;
      std::__cxx11::string::_M_assign((string *)&local_6c0);
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      uVar7 = local_7c8;
      local_138._0_4_ = local_6c8;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_6c0,local_6c0 + local_6b8);
      local_110 = local_6a0;
      local_108._M_p = (pointer)&local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_698,local_698 + local_690);
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_678,local_678 + local_670)
      ;
      local_c8 = local_658;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_7b8,uVar7,2,Uint16,0,0,(BinaryRegionComment *)local_138);
      anon_unknown_49::MakeSingleRegionBinarySection
                ((BinarySection *)local_650,&local_718,VTable,(BinaryRegion *)local_7b8);
      AddSection(local_7c0,uVar7,(BinarySection *)local_650);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_628);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_650._4_4_,local_650._0_4_) != &local_640) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_650._4_4_,local_650._0_4_),
                        local_640._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_p != &local_730) {
        operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._M_p != &local_750) {
        operator_delete(local_760._M_p,local_750._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_p != &local_778) {
        operator_delete(local_788._M_p,local_778._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      _Var12._M_p = local_130._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
LAB_00310988:
        operator_delete(_Var12._M_p,local_120._M_allocated_capacity + 1);
      }
    }
  }
  pVVar13 = (VTable *)0x0;
LAB_0031099b:
  if (local_678 != &local_668) {
    operator_delete(local_678,CONCAT71(uStack_667,local_668) + 1);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698,CONCAT71(uStack_687,local_688) + 1);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0,CONCAT71(uStack_6af,local_6b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  return pVVar13;
}

Assistant:

BinaryAnnotator::VTable *BinaryAnnotator::GetOrBuildVTable(
    const uint64_t vtable_offset, const reflection::Object *const table,
    const uint64_t offset_of_referring_table) {
  // Get a list of vtables (if any) already defined at this offset.
  std::list<VTable> &vtables = vtables_[vtable_offset];

  // See if this vtable for the table type has been generated before.
  for (VTable &vtable : vtables) {
    if (vtable.referring_table == table) { return &vtable; }
  }

  // If we are trying to make a new vtable and it is already encompassed by
  // another binary section, something is corrupted.
  if (vtables.empty() && ContainsSection(vtable_offset)) { return nullptr; }

  const std::string referring_table_name = table->name()->str();

  BinaryRegionComment vtable_size_comment;
  vtable_size_comment.type = BinaryRegionCommentType::VTableSize;

  const auto vtable_length = ReadScalar<uint16_t>(vtable_offset);
  if (!vtable_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vtable_offset);

    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, remaining,
                                    BinaryRegionType::Unknown, remaining, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  // Vtables start with the size of the vtable
  const uint16_t vtable_size = vtable_length.value();

  if (!IsValidOffset(vtable_offset + vtable_size - 1)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    // The vtable_size points to off the end of the binary.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));

    return nullptr;
  } else if (vtable_size < 2 * sizeof(uint16_t)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
    // The size includes itself and the table size which are both uint16_t.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     vtable_size_comment));
  uint64_t offset = vtable_offset + sizeof(uint16_t);

  BinaryRegionComment ref_table_len_comment;
  ref_table_len_comment.type =
      BinaryRegionCommentType::VTableRefferingTableLength;

  // Ensure we can read the next uint16_t field, which is the size of the
  // referring table.
  const auto table_length = ReadScalar<uint16_t>(offset);

  if (!table_length.has_value()) {
    const uint64_t remaining = RemainingBytes(offset);
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(offset, MakeSingleRegionBinarySection(
                           referring_table_name, BinarySectionType::VTable,
                           MakeBinaryRegion(
                               offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, ref_table_len_comment)));
    return nullptr;
  }

  // Then they have the size of the table they reference.
  const uint16_t table_size = table_length.value();

  if (!IsValidOffset(offset_of_referring_table + table_size - 1)) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
  } else if (table_size < 4) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     ref_table_len_comment));
  offset += sizeof(uint16_t);

  const uint64_t offset_start = offset;

  // A mapping between field (and its id) to the relative offset (uin16_t) from
  // the start of the table.
  std::map<uint16_t, VTable::Entry> fields;

  // Counter for determining if the binary has more vtable entries than the
  // schema provided. This can occur if the binary was created at a newer schema
  // version and is being processed with an older one.
  uint16_t fields_processed = 0;

  // Loop over all the fields.
  ForAllFields(table, /*reverse=*/false, [&](const reflection::Field *field) {
    const uint64_t field_offset = offset_start + field->id() * sizeof(uint16_t);

    if (field_offset >= vtable_offset + vtable_size) {
      // This field_offset is too large for this vtable, so it must come from a
      // newer schema than the binary was create with or the binary writer did
      // not write it. For either case, it is safe to ignore.

      // TODO(dbaileychess): We could show which fields are not set an their
      // default values if we want. We just need a way to make it obvious that
      // it isn't part of the buffer.
      return;
    }

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableFieldOffset;
    field_comment.name = std::string(field->name()->c_str()) +
                         "` (id: " + std::to_string(field->id()) + ")";

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);

      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));

      return;
    }

    if (!IsValidOffset(offset_of_referring_table + offset_from_table.value() -
                       1)) {
      SetError(field_comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
      regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                         BinaryRegionType::VOffset, 0, 0,
                                         field_comment));
      return;
    }

    VTable::Entry entry;
    entry.field = field;
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(field->id(), entry));

    std::string default_label;
    if (offset_from_table.value() == 0) {
      // Not present, so could be default or be optional.
      if (field->required()) {
        SetError(field_comment,
                 BinaryRegionStatus::ERROR_REQUIRED_FIELD_NOT_PRESENT);
        // If this is a required field, make it known this is an error.
        regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                           BinaryRegionType::VOffset, 0, 0,
                                           field_comment));
        return;
      } else {
        // Its an optional field, so get the default value and interpret and
        // provided an annotation for it.
        if (IsScalar(field->type()->base_type())) {
          default_label += "<defaults to ";
          default_label += IsFloat(field->type()->base_type())
                               ? std::to_string(field->default_real())
                               : std::to_string(field->default_integer());
          default_label += "> (";
        } else {
          default_label += "<null> (";
        }
        default_label +=
            reflection::EnumNameBaseType(field->type()->base_type());
        default_label += ")";
      }
    }
    field_comment.default_value = default_label;

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));

    fields_processed++;
  });

  // Check if we covered all the expectant fields. If not, we need to add them
  // as unknown fields.
  uint16_t expectant_vtable_fields =
      (vtable_size - sizeof(uint16_t) - sizeof(uint16_t)) / sizeof(uint16_t);

  // Prevent a bad binary from declaring a really large vtable_size, that we can
  // not independently verify.
  expectant_vtable_fields = std::min(
      static_cast<uint16_t>(fields_processed * 3), expectant_vtable_fields);

  for (uint16_t id = fields_processed; id < expectant_vtable_fields; ++id) {
    const uint64_t field_offset = offset_start + id * sizeof(uint16_t);

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableUnknownFieldOffset;
    field_comment.index = id;

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);
      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));
      continue;
    }

    VTable::Entry entry;
    entry.field = nullptr;  // No field to reference.
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(id, entry));

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));
  }

  // If we have never added this vtable before record the Binary section.
  if (vtables.empty()) {
    sections_[vtable_offset] = MakeBinarySection(
        referring_table_name, BinarySectionType::VTable, std::move(regions));
  } else {
    // Add the current table name to the name of the section.
    sections_[vtable_offset].name += ", " + referring_table_name;
  }

  VTable vtable;
  vtable.referring_table = table;
  vtable.fields = std::move(fields);
  vtable.table_size = table_size;
  vtable.vtable_size = vtable_size;

  // Add this vtable to the collection of vtables at this offset.
  vtables.push_back(std::move(vtable));

  // Return the vtable we just added.
  return &vtables.back();
}